

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

string * __thiscall
cmInstallCommand::GetDestinationForType
          (string *__return_storage_ptr__,cmInstallCommand *this,cmInstallCommandArguments *args,
          string *type)

{
  bool bVar1;
  string *psVar2;
  allocator<char> local_21;
  
  if ((args != (cmInstallCommandArguments *)0x0) &&
     (psVar2 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args),
     psVar2->_M_string_length != 0)) {
    psVar2 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    return __return_storage_ptr__;
  }
  bVar1 = std::operator==(type,"BIN");
  if (bVar1) {
    GetRuntimeDestination_abi_cxx11_(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
  }
  else {
    bVar1 = std::operator==(type,"SBIN");
    if (bVar1) {
      GetSbinDestination_abi_cxx11_(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
    }
    else {
      bVar1 = std::operator==(type,"SYSCONF");
      if (bVar1) {
        GetSysconfDestination_abi_cxx11_
                  (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
      }
      else {
        bVar1 = std::operator==(type,"SHAREDSTATE");
        if (bVar1) {
          GetSharedStateDestination_abi_cxx11_
                    (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
        }
        else {
          bVar1 = std::operator==(type,"LOCALSTATE");
          if (bVar1) {
            GetLocalStateDestination_abi_cxx11_
                      (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
          }
          else {
            bVar1 = std::operator==(type,"RUNSTATE");
            if (bVar1) {
              GetRunStateDestination_abi_cxx11_
                        (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
            }
            else {
              bVar1 = std::operator==(type,"LIB");
              if (bVar1) {
                GetLibraryDestination_abi_cxx11_
                          (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
              }
              else {
                bVar1 = std::operator==(type,"INCLUDE");
                if (bVar1) {
                  GetIncludeDestination_abi_cxx11_
                            (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
                }
                else {
                  bVar1 = std::operator==(type,"DATA");
                  if (bVar1) {
                    GetDataDestination_abi_cxx11_
                              (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
                  }
                  else {
                    bVar1 = std::operator==(type,"INFO");
                    if (bVar1) {
                      GetInfoDestination_abi_cxx11_
                                (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
                    }
                    else {
                      bVar1 = std::operator==(type,"LOCALE");
                      if (bVar1) {
                        GetLocaleDestination_abi_cxx11_
                                  (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
                      }
                      else {
                        bVar1 = std::operator==(type,"MAN");
                        if (bVar1) {
                          GetManDestination_abi_cxx11_
                                    (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
                        }
                        else {
                          bVar1 = std::operator==(type,"DOC");
                          if (bVar1) {
                            GetDocDestination_abi_cxx11_
                                      (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0)
                            ;
                          }
                          else {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)__return_storage_ptr__,"",&local_21);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallCommand::GetDestinationForType(
  const cmInstallCommandArguments* args, const std::string& type)
{
  if (args && !args->GetDestination().empty()) {
    return args->GetDestination();
  }
  if (type == "BIN") {
    return this->GetRuntimeDestination(nullptr);
  }
  if (type == "SBIN") {
    return this->GetSbinDestination(nullptr);
  }
  if (type == "SYSCONF") {
    return this->GetSysconfDestination(nullptr);
  }
  if (type == "SHAREDSTATE") {
    return this->GetSharedStateDestination(nullptr);
  }
  if (type == "LOCALSTATE") {
    return this->GetLocalStateDestination(nullptr);
  }
  if (type == "RUNSTATE") {
    return this->GetRunStateDestination(nullptr);
  }
  if (type == "LIB") {
    return this->GetLibraryDestination(nullptr);
  }
  if (type == "INCLUDE") {
    return this->GetIncludeDestination(nullptr);
  }
  if (type == "DATA") {
    return this->GetDataDestination(nullptr);
  }
  if (type == "INFO") {
    return this->GetInfoDestination(nullptr);
  }
  if (type == "LOCALE") {
    return this->GetLocaleDestination(nullptr);
  }
  if (type == "MAN") {
    return this->GetManDestination(nullptr);
  }
  if (type == "DOC") {
    return this->GetDocDestination(nullptr);
  }
  return "";
}